

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_affine.h
# Opt level: O1

void __thiscall
mp::LinTerms::LinTerms
          (LinTerms *this,vector<double,_std::allocator<double>_> *c,
          vector<int,_std::allocator<int>_> *v)

{
  undefined1 local_12;
  undefined1 local_11;
  
  gch::detail::small_vector_base<std::allocator<double>,6u>::
  small_vector_base<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
            ((small_vector_base<std::allocator<double>,6u> *)this,
             (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish,&local_11);
  gch::detail::small_vector_base<std::allocator<int>,6u>::
  small_vector_base<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((small_vector_base<std::allocator<int>,6u> *)&this->vars_,
             (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish,&local_12);
  return;
}

Assistant:

LinTerms(const std::vector<double>& c, const std::vector<int>& v)
      : coefs_(c.begin(), c.end()), vars_(v.begin(), v.end())
  { assert(check()); }